

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

void destroy_expectation_if_time_to_die(RecordedExpectation *expectation)

{
  _Bool _Var1;
  RecordedExpectation *in_RDI;
  char *in_stack_00000010;
  
  _Var1 = is_always_call(in_RDI);
  if ((!_Var1) && (in_RDI->time_to_live = in_RDI->time_to_live + -1, in_RDI->time_to_live < 1)) {
    remove_expectation_for(in_stack_00000010);
    destroy_expectation((RecordedExpectation *)0x10d122);
  }
  return;
}

Assistant:

static void destroy_expectation_if_time_to_die(RecordedExpectation *expectation) {

    if (is_always_call(expectation)) {
        return;
    }

    /* TODO: expectation->decrement_time_to_live_if_necessary(); if (expectation->time_to_die()) { ... } */
    expectation->time_to_live--;

    if (expectation->time_to_live <= 0) {
        remove_expectation_for(expectation->function);
        destroy_expectation(expectation);
    }
}